

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O1

bool __thiscall despot::Planner::RunStep(Planner *this,Solver *solver,World *world,Logger *logger)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  log_ostream *plVar5;
  size_t sVar6;
  ostream *poVar7;
  char *__s;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  timeval tv;
  OBS_TYPE obs;
  timeval local_68;
  undefined8 local_58;
  long local_50;
  long local_48;
  Planner *local_40;
  Logger *local_38;
  
  local_40 = this;
  local_38 = logger;
  Logger::CheckTargetTime(logger);
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  local_48 = local_68.tv_sec;
  local_50 = local_68.tv_usec;
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  dVar8 = (double)local_68.tv_sec;
  dVar9 = (double)local_68.tv_usec;
  uVar2 = (*solver->_vptr_Solver[2])(solver);
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  dVar10 = (double)local_68.tv_sec;
  dVar11 = (double)local_68.tv_usec;
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"[RunStep] Time spent in ",0x18);
      __s = *(char **)(solver->_vptr_Solver[-1] + 8) +
            (**(char **)(solver->_vptr_Solver[-1] + 8) == '*');
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar5->super_ostream,__s,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar5->super_ostream,"::Search(): ",0xc);
      poVar7 = std::ostream::_M_insert<double>
                         ((dVar11 / 1000000.0 + dVar10) - (dVar9 / 1000000.0 + dVar8));
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  dVar8 = (double)local_68.tv_sec;
  dVar9 = (double)local_68.tv_usec;
  uVar4 = (*world->_vptr_World[6])(world,(ulong)uVar2,&local_58);
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  dVar10 = (double)local_68.tv_sec;
  dVar11 = (double)local_68.tv_usec;
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"[RunStep] Time spent in ExecuteAction(): ",0x29);
      poVar7 = std::ostream::_M_insert<double>
                         ((dVar11 / 1000000.0 + dVar10) - (dVar9 / 1000000.0 + dVar8));
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  dVar8 = (double)local_68.tv_sec;
  dVar9 = (double)local_68.tv_usec;
  (*solver->_vptr_Solver[3])(solver,(ulong)uVar2,local_58);
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"[RunStep] Time spent in Update(): ",0x22);
      poVar7 = std::ostream::_M_insert<double>
                         (((double)local_68.tv_usec / 1000000.0 + (double)local_68.tv_sec) -
                          (dVar9 / 1000000.0 + dVar8));
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  uVar1 = local_40->step_;
  local_40->step_ = uVar1 + 1;
  iVar3 = (*local_38->_vptr_Logger[4])
                    ((double)local_48 + (double)local_50 / 1000000.0,local_38,(ulong)uVar1,
                     (ulong)(uint)local_40->round_,(ulong)(uVar4 & 0xff),(ulong)uVar2,local_58);
  return SUB41(iVar3,0);
}

Assistant:

bool Planner::RunStep(Solver* solver, World* world, Logger* logger) {

	logger->CheckTargetTime();

	double step_start_t = get_time_second();

	double start_t = get_time_second();
	ACT_TYPE action = solver->Search().action;
	double end_t = get_time_second();
	double search_time = (end_t - start_t);
	logi << "[RunStep] Time spent in " << typeid(*solver).name()
			<< "::Search(): " << search_time << endl;

	OBS_TYPE obs;
	start_t = get_time_second();
	bool terminal = world->ExecuteAction(action, obs);
	end_t = get_time_second();
	double execute_time = (end_t - start_t);
	logi << "[RunStep] Time spent in ExecuteAction(): " << execute_time << endl;

	start_t = get_time_second();
	solver->BeliefUpdate(action, obs);
	end_t = get_time_second();
	double update_time = (end_t - start_t);
	logi << "[RunStep] Time spent in Update(): " << update_time << endl;

	return logger->SummarizeStep(step_++, round_, terminal, action, obs,
			step_start_t);
}